

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ulong prefixSize;
  uint uVar1;
  LZ4_byte *dictStart;
  
  prefixSize = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (prefixSize == 0) {
    uVar1 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (prefixSize < 0xffff) {
        if ((LZ4_streamDecode->internal_donotuse).extDictSize == 0) {
          uVar1 = LZ4_decompress_safe_withSmallPrefix
                            (source,dest,compressedSize,maxOutputSize,prefixSize);
        }
        else {
          uVar1 = LZ4_decompress_generic
                            (source,dest,compressedSize,maxOutputSize,decode_full_block,usingExtDict
                             ,(BYTE *)(dest + -prefixSize),
                             (LZ4_streamDecode->internal_donotuse).externalDict,
                             (LZ4_streamDecode->internal_donotuse).extDictSize);
        }
      }
      else {
        uVar1 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      if ((int)uVar1 < 1) {
        return uVar1;
      }
      (LZ4_streamDecode->internal_donotuse).prefixSize =
           (LZ4_streamDecode->internal_donotuse).prefixSize + (ulong)uVar1;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar1;
      return uVar1;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = prefixSize;
    dictStart = (LZ4_streamDecode->internal_donotuse).prefixEnd + -prefixSize;
    (LZ4_streamDecode->internal_donotuse).externalDict = dictStart;
    uVar1 = LZ4_decompress_safe_forceExtDict
                      (source,dest,compressedSize,maxOutputSize,dictStart,prefixSize);
  }
  if (0 < (int)uVar1) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (ulong)uVar1;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar1);
  }
  return uVar1;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}